

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

double * cheby_t_poly_zero(int n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double dVar4;
  double *z;
  double r8_pi;
  int i;
  double angle;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  for (r8_pi._4_4_ = 0; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
    dVar4 = cos(((double)(r8_pi._4_4_ * 2 + 1) * 3.141592653589793) / (double)(n << 1));
    pdVar3[r8_pi._4_4_] = dVar4;
  }
  return pdVar3;
}

Assistant:

double *cheby_t_poly_zero ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBY_T_POLY_ZERO returns zeroes of Chebyshev polynomials T(n,x).
//
//  Discussion:
//
//    The I-th zero of T(N,X) is cos((2*I-1)*PI/(2*N)), I = 1 to N
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the polynomial.
//
//    Output, double CHEBY_T_POLY_ZERO[N], the zeroes of T(N,X).
//
{
  double angle;
  int i;
  const double r8_pi = 3.141592653589793;
  double *z;

  z = new double[n];

  for ( i = 0; i < n; i++ )
  {
    angle = double( 2 * i + 1 ) * r8_pi / double( 2 * n );
    z[i] = cos ( angle );
  }

  return z;
}